

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O3

int __thiscall
tcmalloc::CentralFreeList::RemoveRange(CentralFreeList *this,void **start,void **end,int N)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  void *local_40;
  void *head;
  void *tail;
  
  LOCK();
  bVar4 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar4) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock(&this->lock_);
  }
  if (((&DAT_00163304)[(uint)this->size_class_] == N) && (0 < this->used_slots_)) {
    uVar1 = this->used_slots_ - 1;
    this->used_slots_ = uVar1;
    *start = this->tc_slots_[uVar1].head;
    *end = this->tc_slots_[uVar1].tail;
    LOCK();
    iVar2 = (this->lock_).lockword_.super___atomic_base<int>._M_i;
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
  }
  else {
    *start = (void *)0x0;
    *end = (void *)0x0;
    iVar2 = FetchFromOneSpansSafe(this,N,start,end);
    iVar3 = 0;
    if (iVar2 != 0) {
      for (; iVar3 = iVar2, iVar3 < N; iVar2 = iVar3 + iVar2) {
        local_40 = (void *)0x0;
        head = (void *)0x0;
        iVar2 = FetchFromOneSpans(this,N - iVar3,&local_40,&head);
        if (iVar2 == 0) break;
        if (local_40 != (void *)0x0) {
          *(void **)head = *start;
          *start = local_40;
        }
      }
    }
    LOCK();
    iVar2 = (this->lock_).lockword_.super___atomic_base<int>._M_i;
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    N = iVar3;
  }
  if (iVar2 != 1) {
    SpinLock::SlowUnlock(&this->lock_);
  }
  return N;
}

Assistant:

int CentralFreeList::RemoveRange(void **start, void **end, int N) {
  ASSERT(N > 0);
  lock_.Lock();
  if (N == Static::sizemap()->num_objects_to_move(size_class_) &&
      used_slots_ > 0) {
    int slot = --used_slots_;
    ASSERT(slot >= 0);
    TCEntry *entry = &tc_slots_[slot];
    *start = entry->head;
    *end = entry->tail;
    lock_.Unlock();
    return N;
  }

  int result = 0;
  *start = nullptr;
  *end = nullptr;
  // TODO: Prefetch multiple TCEntries?
  result = FetchFromOneSpansSafe(N, start, end);
  if (result != 0) {
    while (result < N) {
      int n;
      void* head = nullptr;
      void* tail = nullptr;
      n = FetchFromOneSpans(N - result, &head, &tail);
      if (!n) break;
      result += n;
      SLL_PushRange(start, head, tail);
    }
  }
  lock_.Unlock();
  return result;
}